

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * soul::Value::createUnsizedArray(Value *__return_storage_ptr__,Type *elementType,Handle h)

{
  bool bVar1;
  PackedData local_68;
  Type local_40;
  undefined1 local_21;
  Handle local_20;
  Handle h_local;
  Type *elementType_local;
  Value *v;
  
  local_20 = h;
  h_local = (Handle)elementType;
  elementType_local = &__return_storage_ptr__->type;
  bVar1 = Type::isUnsizedArray(elementType);
  checkAssertion(!bVar1,"! elementType.isUnsizedArray()","createUnsizedArray",0x1ee);
  local_21 = 0;
  Type::createUnsizedArray(&local_40,(Type *)h_local);
  Value(__return_storage_ptr__,&local_40);
  Type::~Type(&local_40);
  getData(&local_68,__return_storage_ptr__);
  PackedData::setAs<long>(&local_68,local_20);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createUnsizedArray (const Type& elementType, ConstantTable::Handle h)
{
    SOUL_ASSERT (! elementType.isUnsizedArray());  // this may need to be removed at some point, but is here as a useful sanity-check
    Value v (elementType.createUnsizedArray());
    v.getData().setAs (h);
    return v;
}